

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool llbuild::buildsystem::pathIsPrefixedByPath(string *path,string *prefixPath)

{
  __type _Var1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  reference pcVar7;
  bool local_e2;
  bool local_e1;
  bool local_d2;
  bool local_d1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  bool local_91;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_90;
  bool isPrefix;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined1 local_78 [8];
  pair<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [8];
  string pathSeparators;
  string *prefixPath_local;
  string *path_local;
  
  pathSeparators.field_2._8_8_ = prefixPath;
  basic::sys::getPathSeparators_abi_cxx11_();
  uVar3 = std::__cxx11::string::length();
  uVar4 = std::__cxx11::string::length();
  if (uVar4 < uVar3) {
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)&local_60,(ulong)prefixPath);
    _Var1 = std::operator==(&local_60,path);
    local_d1 = false;
    if (_Var1) {
      std::__cxx11::string::length();
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)prefixPath);
      lVar6 = std::__cxx11::string::find((char)local_40,(ulong)(uint)(int)*pcVar5);
      local_d1 = lVar6 != -1;
    }
    path_local._7_1_ = local_d1;
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    local_80._M_current = (char *)std::__cxx11::string::begin();
    local_88._M_current = (char *)std::__cxx11::string::end();
    _Stack_90._M_current = (char *)std::__cxx11::string::begin();
    _local_78 = std::
                mismatch<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                          (local_80,local_88,_Stack_90);
    local_a0._M_current = (char *)std::__cxx11::string::end();
    bVar2 = __gnu_cxx::operator==
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_78,&local_a0);
    local_d2 = true;
    if (!bVar2) {
      local_a8 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_78,0);
      pcVar7 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_a8);
      lVar6 = std::__cxx11::string::find((char)local_40,(ulong)(uint)(int)*pcVar7);
      local_d2 = lVar6 != -1;
    }
    local_91 = local_d2;
    local_e1 = false;
    if (local_d2 != false) {
      local_b0._M_current = (char *)std::__cxx11::string::end();
      bVar2 = __gnu_cxx::operator==(&res.first,&local_b0);
      local_e2 = true;
      if (!bVar2) {
        local_b8 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator++(&res.first,0);
        pcVar7 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_b8);
        lVar6 = std::__cxx11::string::find((char)local_40,(ulong)(uint)(int)*pcVar7);
        local_e2 = lVar6 != -1;
      }
      local_e1 = local_e2;
    }
    path_local._7_1_ = local_e1;
  }
  res.second._M_current._4_4_ = 1;
  std::__cxx11::string::~string(local_40);
  return path_local._7_1_;
}

Assistant:

bool llbuild::buildsystem::pathIsPrefixedByPath(std::string path,
                                                std::string prefixPath) {
  std::string pathSeparators = llbuild::basic::sys::getPathSeparators();
  // Note: GCC 4.8 doesn't support the mismatch(first1, last1, first2, last2)
  // overload, just mismatch(first1, last1, first2), so we have to handle the
  // case where prefixPath is longer than path.
  if (prefixPath.length() > path.length()) {
    // The only case where the prefix can be longer and still be a valid prefix
    // is "/foo/" is a prefix of "/foo"
    return prefixPath.substr(0, prefixPath.length() - 1) == path &&
           pathSeparators.find(prefixPath[prefixPath.length() - 1]) !=
               std::string::npos;
  }
  auto res = std::mismatch(prefixPath.begin(), prefixPath.end(), path.begin());
  // Check if `prefixPath` has been exhausted or just a separator remains.
  bool isPrefix = res.first == prefixPath.end() ||
                  (pathSeparators.find(*(res.first++)) != std::string::npos);
  // Check if `path` has been exhausted or just a separator remains.
  return isPrefix &&
         (res.second == path.end() ||
          (pathSeparators.find(*(res.second++)) != std::string::npos));
}